

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

bool __thiscall draco::ObjDecoder::ParseMaterial(ObjDecoder *this,Status *param_1)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  bool bVar6;
  array<char,_6UL> c;
  string mat_name;
  DecoderBuffer line_buffer;
  string local_80;
  DecoderBuffer local_60;
  
  if ((this->counting_mode_ != false) || (-1 < this->material_att_id_)) {
    lVar2 = (this->buffer_).pos_;
    if ((lVar2 + 6 <= (this->buffer_).data_size_) &&
       (pcVar3 = (this->buffer_).data_,
       *(short *)(pcVar3 + lVar2 + 4) == 0x6c74 && *(int *)(pcVar3 + lVar2) == 0x6d657375)) {
      (this->buffer_).pos_ = lVar2 + 6;
      parser::ParseLineIntoDecoderBuffer(&local_60,&this->buffer_);
      parser::SkipWhitespace(&local_60);
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      parser::ParseLine(&local_60,&local_80);
      bVar6 = local_80._M_string_length != 0;
      if (bVar6) {
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->material_name_to_id_)._M_h,&local_80);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar1 = this->num_materials_;
          this->last_material_id_ = iVar1;
          this->num_materials_ = iVar1 + 1;
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->material_name_to_id_,&local_80);
          *pmVar5 = iVar1;
        }
        else {
          this->last_material_id_ =
               *(int *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                              ._M_cur + 0x28);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      DecoderBuffer::BitDecoder::~BitDecoder(&local_60.bit_decoder_);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool ObjDecoder::ParseMaterial(Status * /* status */) {
  // In second pass, skip when we don't use materials.
  if (!counting_mode_ && material_att_id_ < 0) {
    return false;
  }
  std::array<char, 6> c;
  if (!buffer()->Peek(&c)) {
    return false;
  }
  if (std::memcmp(&c[0], "usemtl", 6) != 0) {
    return false;
  }
  buffer()->Advance(6);
  DecoderBuffer line_buffer = parser::ParseLineIntoDecoderBuffer(buffer());
  parser::SkipWhitespace(&line_buffer);
  std::string mat_name;
  parser::ParseLine(&line_buffer, &mat_name);
  if (mat_name.empty()) {
    return false;
  }
  auto it = material_name_to_id_.find(mat_name);
  if (it == material_name_to_id_.end()) {
    // In first pass, materials found in obj that's not in the .mtl file
    // will be added to the list.
    last_material_id_ = num_materials_;
    material_name_to_id_[mat_name] = num_materials_++;

    return true;
  }
  last_material_id_ = it->second;
  return true;
}